

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

ssize_t nghttp2_hd_inflate_hd_nv
                  (nghttp2_hd_inflater *inflater,nghttp2_hd_nv *nv_out,int *inflate_flags,
                  uint8_t *in,size_t inlen,int in_final)

{
  byte bVar1;
  bool bVar2;
  nghttp2_rcbuf **ppnVar3;
  int iVar4;
  undefined8 uVar5;
  uint8_t *puVar6;
  size_t sVar7;
  byte *in_00;
  long lVar8;
  ulong uVar9;
  byte *last;
  undefined4 uVar10;
  undefined4 uVar11;
  int rfin;
  nghttp2_hd_nv nv;
  int local_90;
  int local_8c;
  nghttp2_hd_nv *local_88;
  byte *local_80;
  nghttp2_buf *local_78;
  nghttp2_hd_huff_decode_context *local_70;
  nghttp2_buf *local_68;
  nghttp2_mem *local_60;
  nghttp2_rcbuf **local_58;
  nghttp2_rcbuf **local_50;
  nghttp2_hd_nv local_48;
  
  local_90 = 0;
  lVar8 = -0x20b;
  if ((inflater->ctx).bad == '\0') {
    local_60 = (inflater->ctx).mem;
    local_8c = in_final;
    nghttp2_rcbuf_decref(inflater->nv_value_keep);
    nghttp2_rcbuf_decref(inflater->nv_name_keep);
    inflater->nv_name_keep = (nghttp2_rcbuf *)0x0;
    inflater->nv_value_keep = (nghttp2_rcbuf *)0x0;
    *inflate_flags = 0;
    last = in;
    if (inlen != 0) {
      last = in + inlen;
      local_70 = &inflater->huff_decode_ctx;
      local_50 = &inflater->valuercbuf;
      local_78 = &inflater->valuebuf;
      local_58 = &inflater->namercbuf;
      local_68 = &inflater->namebuf;
      in_00 = in;
      local_88 = nv_out;
      local_80 = (byte *)inflate_flags;
LAB_00156e4c:
      switch(inflater->state) {
      case NGHTTP2_HD_STATE_EXPECT_TABLE_SIZE:
        if ((*in_00 & 0xe0) == 0x20) {
LAB_00156fa5:
          uVar5 = 0x300000001;
LAB_00156faf:
          inflater->opcode = (int)uVar5;
          inflater->state = (int)((ulong)uVar5 >> 0x20);
          goto LAB_001572b3;
        }
LAB_0015730a:
        uVar9 = 0xfffffffffffffdf5;
        goto LAB_00157438;
      case NGHTTP2_HD_STATE_INFLATE_START:
      case NGHTTP2_HD_STATE_OPCODE:
        bVar1 = *in_00;
        if ((bVar1 & 0xe0) == 0x20) {
          if (inflater->state == NGHTTP2_HD_STATE_OPCODE) goto LAB_0015730a;
          goto LAB_00156fa5;
        }
        if ((char)bVar1 < '\0') {
          uVar5 = 0x400000001;
          goto LAB_00156faf;
        }
        lVar8 = 1;
        if ((bVar1 == 0) || (bVar1 == 0x10)) {
          uVar10 = 2;
          uVar11 = 5;
        }
        else {
          uVar10 = 2;
          uVar11 = 5;
          if (bVar1 != 0x40) {
            lVar8 = 0;
            uVar10 = 3;
            uVar11 = 4;
          }
        }
        inflater->opcode = uVar10;
        inflater->state = uVar11;
        inflater->index_required = *in_00 >> 6 & 1;
        inflater->no_index = (*in_00 & 0xf0) == 0x10;
        in_00 = in_00 + lVar8;
LAB_001572b3:
        bVar2 = false;
        inflater->left = 0;
        inflater->shift = 0;
LAB_001572c4:
        inflate_flags = (int *)local_80;
        if (in_00 == last && !bVar2) goto LAB_001572db;
        goto LAB_00156e4c;
      case NGHTTP2_HD_STATE_READ_TABLE_SIZE:
        local_90 = 0;
        uVar9 = inflater->settings_hd_table_bufsize_max;
        if (inflater->min_hd_table_bufsize_max < inflater->settings_hd_table_bufsize_max) {
          uVar9 = inflater->min_hd_table_bufsize_max;
        }
        uVar9 = hd_inflate_read_len(inflater,&local_90,in_00,last,5,uVar9);
        if (-1 < (long)uVar9) {
          in_00 = in_00 + uVar9;
          if (local_90 == 0) break;
          inflater->min_hd_table_bufsize_max = 0xffffffff;
          (inflater->ctx).hd_table_bufsize_max = inflater->left;
          bVar2 = false;
          hd_context_shrink_table_size(&inflater->ctx,(nghttp2_hd_map *)0x0);
          inflater->state = NGHTTP2_HD_STATE_INFLATE_START;
          goto LAB_001572c4;
        }
        goto LAB_00157438;
      case NGHTTP2_HD_STATE_READ_INDEX:
        sVar7 = 7;
        if (inflater->opcode != NGHTTP2_HD_OPCODE_INDEXED) {
          sVar7 = (ulong)(inflater->index_required != '\0') * 2 + 4;
        }
        local_90 = 0;
        uVar9 = hd_inflate_read_len(inflater,&local_90,in_00,last,sVar7,
                                    (inflater->ctx).hd_table.len + 0x3d);
        if ((long)uVar9 < 0) goto LAB_00157438;
        in_00 = in_00 + uVar9;
        if (local_90 != 0) {
          if (inflater->left == 0) goto LAB_0015730a;
          sVar7 = inflater->left - 1;
          inflater->index = sVar7;
          if (inflater->opcode == NGHTTP2_HD_OPCODE_INDEXED) {
            nghttp2_hd_table_get(&local_48,&inflater->ctx,sVar7);
            local_88->token = local_48.token;
            local_88->flags = local_48.flags;
            *(undefined3 *)&local_88->field_0x15 = local_48._21_3_;
            local_88->name = local_48.name;
            local_88->value = local_48.value;
            goto LAB_0015740a;
          }
LAB_0015714a:
          inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;
          goto switchD_00156e64_default;
        }
        break;
      case NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN:
        inflater->huffman_encoded = *in_00 >> 7;
        inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN;
        inflater->left = 0;
        inflater->shift = 0;
      case NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN:
        local_90 = 0;
        uVar9 = hd_inflate_read_len(inflater,&local_90,in_00,last,7,0x10000);
        if (-1 < (long)uVar9) {
          in_00 = in_00 + uVar9;
          if (local_90 == 0) break;
          if (inflater->huffman_encoded == '\0') {
            inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAME;
            sVar7 = inflater->left;
          }
          else {
            nghttp2_hd_huff_decode_context_init(local_70);
            inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF;
            sVar7 = inflater->left * 2;
          }
          ppnVar3 = local_58;
          iVar4 = nghttp2_rcbuf_new(local_58,sVar7 + 1,local_60);
          if (iVar4 == 0) {
            nghttp2_buf_wrap_init(local_68,(*ppnVar3)->base,(*ppnVar3)->len);
switchD_00156e64_default:
            bVar2 = false;
            goto LAB_001572c4;
          }
LAB_00157435:
          uVar9 = (ulong)iVar4;
        }
        goto LAB_00157438;
      case NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF:
        uVar9 = hd_inflate_read_huff(inflater,local_68,in_00,last);
        if ((long)uVar9 < 0) goto LAB_00157438;
        in_00 = in_00 + uVar9;
        if (inflater->left == 0) {
          puVar6 = (inflater->namebuf).last;
LAB_001570a8:
          *puVar6 = '\0';
          inflater->namercbuf->len = (long)(inflater->namebuf).last - (long)(inflater->namebuf).pos;
          goto LAB_0015714a;
        }
        break;
      case NGHTTP2_HD_STATE_NEWNAME_READ_NAME:
        uVar9 = (long)last - (long)in_00;
        if (inflater->left <= (ulong)((long)last - (long)in_00)) {
          uVar9 = inflater->left;
        }
        puVar6 = nghttp2_cpymem((inflater->namebuf).last,in_00,uVar9);
        (inflater->namebuf).last = puVar6;
        sVar7 = inflater->left;
        inflater->left = sVar7 - uVar9;
        if ((long)uVar9 < 0) goto LAB_00157438;
        in_00 = in_00 + uVar9;
        if (sVar7 == uVar9) goto LAB_001570a8;
        break;
      case NGHTTP2_HD_STATE_CHECK_VALUELEN:
        inflater->huffman_encoded = *in_00 >> 7;
        inflater->state = NGHTTP2_HD_STATE_READ_VALUELEN;
        inflater->left = 0;
        inflater->shift = 0;
      case NGHTTP2_HD_STATE_READ_VALUELEN:
        local_90 = 0;
        uVar9 = hd_inflate_read_len(inflater,&local_90,in_00,last,7,0x10000);
        if (-1 < (long)uVar9) {
          in_00 = in_00 + uVar9;
          if (local_90 == 0) break;
          if (inflater->huffman_encoded == '\0') {
            inflater->state = NGHTTP2_HD_STATE_READ_VALUE;
            sVar7 = inflater->left;
          }
          else {
            nghttp2_hd_huff_decode_context_init(local_70);
            inflater->state = NGHTTP2_HD_STATE_READ_VALUEHUFF;
            sVar7 = inflater->left * 2;
          }
          ppnVar3 = local_50;
          iVar4 = nghttp2_rcbuf_new(local_50,sVar7 + 1,local_60);
          if (iVar4 != 0) goto LAB_00157435;
          nghttp2_buf_wrap_init(local_78,(*ppnVar3)->base,(*ppnVar3)->len);
          bVar2 = true;
          goto LAB_001572c4;
        }
        goto LAB_00157438;
      case NGHTTP2_HD_STATE_READ_VALUEHUFF:
        uVar9 = hd_inflate_read_huff(inflater,local_78,in_00,last);
        if (-1 < (long)uVar9) {
          in_00 = in_00 + uVar9;
          if (inflater->left != 0) break;
          puVar6 = (inflater->valuebuf).last;
LAB_001573a1:
          *puVar6 = '\0';
          inflater->valuercbuf->len =
               (long)(inflater->valuebuf).last - (long)(inflater->valuebuf).pos;
          if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
            iVar4 = hd_inflate_commit_newname(inflater,local_88);
          }
          else {
            iVar4 = hd_inflate_commit_indname(inflater,local_88);
          }
          if (iVar4 == 0) {
LAB_0015740a:
            inflater->state = NGHTTP2_HD_STATE_OPCODE;
            *local_80 = *local_80 | 2;
            goto LAB_0015741c;
          }
          goto LAB_00157435;
        }
        goto LAB_00157438;
      case NGHTTP2_HD_STATE_READ_VALUE:
        uVar9 = (long)last - (long)in_00;
        if (inflater->left <= (ulong)((long)last - (long)in_00)) {
          uVar9 = inflater->left;
        }
        puVar6 = nghttp2_cpymem((inflater->valuebuf).last,in_00,uVar9);
        (inflater->valuebuf).last = puVar6;
        sVar7 = inflater->left;
        inflater->left = sVar7 - uVar9;
        if ((long)uVar9 < 0) goto LAB_00157438;
        in_00 = in_00 + uVar9;
        if (sVar7 == uVar9) goto LAB_001573a1;
        break;
      default:
        goto switchD_00156e64_default;
      }
      uVar9 = 0xfffffffffffffdf5;
      if (local_8c == 0) {
LAB_0015741c:
        return (long)in_00 - (long)in;
      }
      goto LAB_00157438;
    }
LAB_001572db:
    if (local_8c != 0) {
      uVar9 = 0xfffffffffffffdf5;
      if (1 < inflater->state - NGHTTP2_HD_STATE_INFLATE_START) {
LAB_00157438:
        (inflater->ctx).bad = '\x01';
        return uVar9;
      }
      *(byte *)inflate_flags = *(byte *)inflate_flags | 1;
    }
    lVar8 = (long)last - (long)in;
  }
  return lVar8;
}

Assistant:

ssize_t nghttp2_hd_inflate_hd_nv(nghttp2_hd_inflater *inflater,
                                 nghttp2_hd_nv *nv_out, int *inflate_flags,
                                 const uint8_t *in, size_t inlen,
                                 int in_final) {
  ssize_t rv = 0;
  const uint8_t *first = in;
  const uint8_t *last = in + inlen;
  int rfin = 0;
  int busy = 0;
  nghttp2_mem *mem;

  mem = inflater->ctx.mem;

  if (inflater->ctx.bad) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  DEBUGF("inflatehd: start state=%d\n", inflater->state);
  hd_inflate_keep_free(inflater);
  *inflate_flags = NGHTTP2_HD_INFLATE_NONE;
  for (; in != last || busy;) {
    busy = 0;
    switch (inflater->state) {
    case NGHTTP2_HD_STATE_EXPECT_TABLE_SIZE:
      if ((*in & 0xe0u) != 0x20u) {
        DEBUGF("inflatehd: header table size change was expected, but saw "
               "0x%02x as first byte",
               *in);
        rv = NGHTTP2_ERR_HEADER_COMP;
        goto fail;
      }
    /* fall through */
    case NGHTTP2_HD_STATE_INFLATE_START:
    case NGHTTP2_HD_STATE_OPCODE:
      if ((*in & 0xe0u) == 0x20u) {
        DEBUGF("inflatehd: header table size change\n");
        if (inflater->state == NGHTTP2_HD_STATE_OPCODE) {
          DEBUGF("inflatehd: header table size change must appear at the head "
                 "of header block\n");
          rv = NGHTTP2_ERR_HEADER_COMP;
          goto fail;
        }
        inflater->opcode = NGHTTP2_HD_OPCODE_INDEXED;
        inflater->state = NGHTTP2_HD_STATE_READ_TABLE_SIZE;
      } else if (*in & 0x80u) {
        DEBUGF("inflatehd: indexed repr\n");
        inflater->opcode = NGHTTP2_HD_OPCODE_INDEXED;
        inflater->state = NGHTTP2_HD_STATE_READ_INDEX;
      } else {
        if (*in == 0x40u || *in == 0 || *in == 0x10u) {
          DEBUGF("inflatehd: literal header repr - new name\n");
          inflater->opcode = NGHTTP2_HD_OPCODE_NEWNAME;
          inflater->state = NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN;
        } else {
          DEBUGF("inflatehd: literal header repr - indexed name\n");
          inflater->opcode = NGHTTP2_HD_OPCODE_INDNAME;
          inflater->state = NGHTTP2_HD_STATE_READ_INDEX;
        }
        inflater->index_required = (*in & 0x40) != 0;
        inflater->no_index = (*in & 0xf0u) == 0x10u;
        DEBUGF("inflatehd: indexing required=%d, no_index=%d\n",
               inflater->index_required, inflater->no_index);
        if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
          ++in;
        }
      }
      inflater->left = 0;
      inflater->shift = 0;
      break;
    case NGHTTP2_HD_STATE_READ_TABLE_SIZE:
      rfin = 0;
      rv = hd_inflate_read_len(
          inflater, &rfin, in, last, 5,
          nghttp2_min(inflater->min_hd_table_bufsize_max,
                      inflater->settings_hd_table_bufsize_max));
      if (rv < 0) {
        goto fail;
      }
      in += rv;
      if (!rfin) {
        goto almost_ok;
      }
      DEBUGF("inflatehd: table_size=%zu\n", inflater->left);
      inflater->min_hd_table_bufsize_max = UINT32_MAX;
      inflater->ctx.hd_table_bufsize_max = inflater->left;
      hd_context_shrink_table_size(&inflater->ctx, NULL);
      inflater->state = NGHTTP2_HD_STATE_INFLATE_START;
      break;
    case NGHTTP2_HD_STATE_READ_INDEX: {
      size_t prefixlen;

      if (inflater->opcode == NGHTTP2_HD_OPCODE_INDEXED) {
        prefixlen = 7;
      } else if (inflater->index_required) {
        prefixlen = 6;
      } else {
        prefixlen = 4;
      }

      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, prefixlen,
                               get_max_index(&inflater->ctx));
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      if (!rfin) {
        goto almost_ok;
      }

      if (inflater->left == 0) {
        rv = NGHTTP2_ERR_HEADER_COMP;
        goto fail;
      }

      DEBUGF("inflatehd: index=%zu\n", inflater->left);
      if (inflater->opcode == NGHTTP2_HD_OPCODE_INDEXED) {
        inflater->index = inflater->left;
        --inflater->index;

        hd_inflate_commit_indexed(inflater, nv_out);

        inflater->state = NGHTTP2_HD_STATE_OPCODE;
        *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;
        return (ssize_t)(in - first);
      } else {
        inflater->index = inflater->left;
        --inflater->index;

        inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;
      }
      break;
    }
    case NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN:
      hd_inflate_set_huffman_encoded(inflater, in);
      inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN;
      inflater->left = 0;
      inflater->shift = 0;
      DEBUGF("inflatehd: huffman encoded=%d\n", inflater->huffman_encoded != 0);
    /* Fall through */
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN:
      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, 7, NGHTTP2_HD_MAX_NV);
      if (rv < 0) {
        goto fail;
      }
      in += rv;
      if (!rfin) {
        DEBUGF("inflatehd: integer not fully decoded. current=%zu\n",
               inflater->left);

        goto almost_ok;
      }

      if (inflater->huffman_encoded) {
        nghttp2_hd_huff_decode_context_init(&inflater->huff_decode_ctx);

        inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF;

        rv = nghttp2_rcbuf_new(&inflater->namercbuf, inflater->left * 2 + 1,
                               mem);
      } else {
        inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAME;
        rv = nghttp2_rcbuf_new(&inflater->namercbuf, inflater->left + 1, mem);
      }

      if (rv != 0) {
        goto fail;
      }

      nghttp2_buf_wrap_init(&inflater->namebuf, inflater->namercbuf->base,
                            inflater->namercbuf->len);

      break;
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF:
      rv = hd_inflate_read_huff(inflater, &inflater->namebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->namebuf.last = '\0';
      inflater->namercbuf->len = nghttp2_buf_len(&inflater->namebuf);

      inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;

      break;
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAME:
      rv = hd_inflate_read(inflater, &inflater->namebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);
      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->namebuf.last = '\0';
      inflater->namercbuf->len = nghttp2_buf_len(&inflater->namebuf);

      inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;

      break;
    case NGHTTP2_HD_STATE_CHECK_VALUELEN:
      hd_inflate_set_huffman_encoded(inflater, in);
      inflater->state = NGHTTP2_HD_STATE_READ_VALUELEN;
      inflater->left = 0;
      inflater->shift = 0;
      DEBUGF("inflatehd: huffman encoded=%d\n", inflater->huffman_encoded != 0);
    /* Fall through */
    case NGHTTP2_HD_STATE_READ_VALUELEN:
      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, 7, NGHTTP2_HD_MAX_NV);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      if (!rfin) {
        goto almost_ok;
      }

      DEBUGF("inflatehd: valuelen=%zu\n", inflater->left);

      if (inflater->huffman_encoded) {
        nghttp2_hd_huff_decode_context_init(&inflater->huff_decode_ctx);

        inflater->state = NGHTTP2_HD_STATE_READ_VALUEHUFF;

        rv = nghttp2_rcbuf_new(&inflater->valuercbuf, inflater->left * 2 + 1,
                               mem);
      } else {
        inflater->state = NGHTTP2_HD_STATE_READ_VALUE;

        rv = nghttp2_rcbuf_new(&inflater->valuercbuf, inflater->left + 1, mem);
      }

      if (rv != 0) {
        goto fail;
      }

      nghttp2_buf_wrap_init(&inflater->valuebuf, inflater->valuercbuf->base,
                            inflater->valuercbuf->len);

      busy = 1;

      break;
    case NGHTTP2_HD_STATE_READ_VALUEHUFF:
      rv = hd_inflate_read_huff(inflater, &inflater->valuebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->valuebuf.last = '\0';
      inflater->valuercbuf->len = nghttp2_buf_len(&inflater->valuebuf);

      if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
        rv = hd_inflate_commit_newname(inflater, nv_out);
      } else {
        rv = hd_inflate_commit_indname(inflater, nv_out);
      }

      if (rv != 0) {
        goto fail;
      }

      inflater->state = NGHTTP2_HD_STATE_OPCODE;
      *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;

      return (ssize_t)(in - first);
    case NGHTTP2_HD_STATE_READ_VALUE:
      rv = hd_inflate_read(inflater, &inflater->valuebuf, in, last);
      if (rv < 0) {
        DEBUGF("inflatehd: value read failure %zd: %s\n", rv,
               nghttp2_strerror((int)rv));
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);
        goto almost_ok;
      }

      *inflater->valuebuf.last = '\0';
      inflater->valuercbuf->len = nghttp2_buf_len(&inflater->valuebuf);

      if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
        rv = hd_inflate_commit_newname(inflater, nv_out);
      } else {
        rv = hd_inflate_commit_indname(inflater, nv_out);
      }

      if (rv != 0) {
        goto fail;
      }

      inflater->state = NGHTTP2_HD_STATE_OPCODE;
      *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;

      return (ssize_t)(in - first);
    }
  }

  assert(in == last);

  DEBUGF("inflatehd: all input bytes were processed\n");

  if (in_final) {
    DEBUGF("inflatehd: in_final set\n");

    if (inflater->state != NGHTTP2_HD_STATE_OPCODE &&
        inflater->state != NGHTTP2_HD_STATE_INFLATE_START) {
      DEBUGF("inflatehd: unacceptable state=%d\n", inflater->state);
      rv = NGHTTP2_ERR_HEADER_COMP;

      goto fail;
    }
    *inflate_flags |= NGHTTP2_HD_INFLATE_FINAL;
  }
  return (ssize_t)(in - first);

almost_ok:
  if (in_final) {
    DEBUGF("inflatehd: input ended prematurely\n");

    rv = NGHTTP2_ERR_HEADER_COMP;

    goto fail;
  }
  return (ssize_t)(in - first);

fail:
  DEBUGF("inflatehd: error return %zd\n", rv);

  inflater->ctx.bad = 1;
  return rv;
}